

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::NoteOldRevision(cmCTestSVN *this)

{
  pointer pSVar1;
  cmCTest *this_00;
  bool bVar2;
  ostream *poVar3;
  pointer svninfo;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  bVar2 = LoadRepositories(this);
  if (bVar2) {
    pSVar1 = (this->Repositories).
             super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (svninfo = (this->Repositories).
                   super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start; svninfo != pSVar1;
        svninfo = svninfo + 1) {
      LoadInfo_abi_cxx11_((string *)&cmCTestLog_msg,this,svninfo);
      std::__cxx11::string::operator=((string *)&svninfo->OldRevision,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar3 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' before update: ");
      poVar3 = std::operator<<(poVar3,(string *)&svninfo->OldRevision);
      std::operator<<(poVar3,"\n");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "   Old revision of external repository \'");
      poVar3 = std::operator<<(poVar3,(string *)svninfo);
      poVar3 = std::operator<<(poVar3,"\' is: ");
      poVar3 = std::operator<<(poVar3,(string *)&svninfo->OldRevision);
      std::operator<<(poVar3,"\n");
      this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x73,local_1c8[0],false);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).OldRevision);
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::NoteOldRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  std::vector<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::vector<SVNInfo>::iterator itend = this->Repositories.end();
  for (; itbeg != itend; itbeg++) {
    SVNInfo& svninfo = *itbeg;
    svninfo.OldRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' before update: " << svninfo.OldRevision << "\n";
    cmCTestLog(
      this->CTest, HANDLER_OUTPUT, "   Old revision of external repository '"
        << svninfo.LocalPath << "' is: " << svninfo.OldRevision << "\n");
  }

  // Set the global old revision to the one of the root
  this->OldRevision = this->RootInfo->OldRevision;
  this->PriorRev.Rev = this->OldRevision;
  return true;
}